

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testNNValidatorBadInputs(void)

{
  bool bVar1;
  NeuralNetwork *pNVar2;
  NeuralNetworkLayer *this;
  InnerProductLayerParams *pIVar3;
  ostream *poVar4;
  Result res;
  Model m1;
  
  CoreML::Specification::Model::Model(&m1);
  pNVar2 = CoreML::Specification::Model::mutable_neuralnetwork(&m1);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar2->layers_);
  pIVar3 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(this);
  pIVar3->hasbias_ = false;
  CoreML::validate<(MLModelType)500>(&res,&m1);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x23c);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"!((res).good())");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return (uint)bVar1;
}

Assistant:

int testNNValidatorBadInputs() {

    Specification::Model m1;

    auto *nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();

    innerProductParams->set_hasbias(false);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);

    return 0;
}